

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

int fy_scan_tag_handle(fy_parser *fyp,_Bool is_directive,fy_atom *handle)

{
  int advance;
  int length;
  fy_atom *handle_local;
  _Bool is_directive_local;
  fy_parser *fyp_local;
  
  advance = fy_scan_tag_handle_length(fyp,0);
  if (advance < 1) {
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x568,"fy_scan_tag_handle","fy_scan_tag_handle_length() failed");
    fyp_local._4_4_ = -1;
  }
  else {
    fy_fill_atom(fyp,advance,handle);
    fyp_local._4_4_ = 0;
  }
  return fyp_local._4_4_;
}

Assistant:

int fy_scan_tag_handle(struct fy_parser *fyp, bool is_directive,
                       struct fy_atom *handle) {
    int length;

    length = fy_scan_tag_handle_length(fyp, 0);
    fyp_error_check(fyp, length > 0, err_out,
                    "fy_scan_tag_handle_length() failed");

    fy_fill_atom(fyp, length, handle);

    return 0;

    err_out:
    return -1;
}